

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

uint32_t pkt_buf_alloc_batch(mempool *mempool,pkt_buf **bufs,uint32_t num_bufs)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = mempool->free_stack_top;
  uVar3 = (ulong)num_bufs;
  uVar5 = (ulong)uVar4;
  if (uVar4 < num_bufs) {
    fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
            "pkt_buf_alloc_batch",mempool,(ulong)uVar4,uVar3);
    uVar3 = (ulong)mempool->free_stack_top;
    uVar5 = uVar3;
  }
  if ((uint32_t)uVar3 != 0) {
    uVar1 = mempool->buf_size;
    lVar2 = 0;
    do {
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
      *(ulong *)((long)bufs + lVar2) =
           (ulong)(*(int *)(&mempool->field_0x14 + uVar5 * 4) * uVar1) + (long)mempool->base_addr;
      lVar2 = lVar2 + 8;
    } while (uVar3 << 3 != lVar2);
    mempool->free_stack_top = uVar4;
  }
  return (uint32_t)uVar3;
}

Assistant:

uint32_t pkt_buf_alloc_batch(struct mempool* mempool, struct pkt_buf* bufs[], uint32_t num_bufs) {
	if (mempool->free_stack_top < num_bufs) {
		warn("memory pool %p only has %d free bufs, requested %d", mempool, mempool->free_stack_top, num_bufs);
		num_bufs = mempool->free_stack_top;
	}
	for (uint32_t i = 0; i < num_bufs; i++) {
		uint32_t entry_id = mempool->free_stack[--mempool->free_stack_top];
		bufs[i] = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + entry_id * mempool->buf_size);
	}
	return num_bufs;
}